

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ProgramInfoLogCase::test(ProgramInfoLogCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  TestLog *pTVar2;
  GLuint shader;
  GLuint shader_00;
  GLuint program;
  char *pcVar3;
  TestContext *pTVar4;
  bool bVar5;
  GLint written;
  ScopedLogSection section;
  StateQueryMemoryWriteGuard<int> logLength;
  char *frgSource;
  char *vtxSource;
  char buffer [2048];
  GLsizei local_9e4;
  ScopedLogSection local_9e0;
  StateQueryMemoryWriteGuard<int> local_9d4;
  char *local_9c8;
  char *local_9c0;
  undefined1 local_9b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9a8 [6];
  ios_base local_940 [264];
  string local_838 [64];
  
  bVar5 = this->m_buildErrorType == BUILDERROR_COMPILE;
  local_9c0 = 
  "#version 300 es\nin highp vec4 a_pos;\nuniform highp vec4 u_uniform;\nvoid main ()\n{\n\tgl_Position = a_pos + u_uniform;\n}\n"
  ;
  if (bVar5) {
    local_9c0 = Functional::(anonymous_namespace)::brokenShader;
  }
  local_9c8 = 
  "#version 300 es\nin highp vec4 v_missingVar;\nuniform highp int u_uniform;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main ()\n{\n\tfragColor = v_missingVar + vec4(float(u_uniform));\n}\n"
  ;
  if (bVar5) {
    local_9c8 = Functional::(anonymous_namespace)::brokenShader;
  }
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  glu::CallLogWrapper::glShaderSource(this_00,shader,1,&local_9c0,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(this_00,shader_00,1,&local_9c8,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  glu::CallLogWrapper::glCompileShader(this_00,shader_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader_00);
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  local_9d4.m_preguard = -0x21212122;
  local_9d4.m_value = -0x21212122;
  local_9d4.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b84,&local_9d4.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
            (&local_9d4,(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
            );
  pTVar2 = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_838[0]._M_dataplus._M_p = (pointer)&local_838[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"QueryLarge","");
  local_9b8._0_8_ = local_9a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9b8,"Query to large buffer","");
  tcu::ScopedLogSection::ScopedLogSection(&local_9e0,pTVar2,local_838,(string *)local_9b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._0_8_ != local_9a8) {
    operator_delete((void *)local_9b8._0_8_,local_9a8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838[0]._M_dataplus._M_p != &local_838[0].field_2) {
    operator_delete(local_838[0]._M_dataplus._M_p,local_838[0].field_2._M_allocated_capacity + 1);
  }
  memset(local_838,0,0x800);
  local_838[0]._M_dataplus._M_p._0_1_ = 0x78;
  local_9e4 = 0;
  glu::CallLogWrapper::glGetProgramInfoLog(this_00,program,0x800,&local_9e4,(GLchar *)local_838);
  if (local_9d4.m_value != 0) {
    if (local_9e4 + 1 == local_9d4.m_value) {
      if (*(char *)((long)&local_838[0]._M_dataplus._M_p + (long)local_9e4) != '\0') {
        local_9b8._0_8_ =
             ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_9b8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"// ERROR: Expected null terminator at index ",0x2c);
        std::ostream::operator<<(poVar1,local_9e4);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_9b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_940);
        pTVar4 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
        if (pTVar4->m_testResult == QP_TEST_RESULT_PASS) {
          pcVar3 = "missing null terminator";
          goto LAB_0123246d;
        }
      }
    }
    else {
      local_9b8._0_8_ =
           ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_9b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"// ERROR: Expected INFO_LOG_LENGTH ",0x23);
      std::ostream::operator<<(poVar1,local_9e4 + 1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"; got ",6);
      std::ostream::operator<<(poVar1,local_9d4.m_value);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_9b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_940);
      pTVar4 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      if (pTVar4->m_testResult == QP_TEST_RESULT_PASS) {
        pcVar3 = "got invalid log length";
LAB_0123246d:
        tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_FAIL,pcVar3);
      }
    }
  }
  tcu::TestLog::endSection(local_9e0.m_log);
  if (0x7ff < local_9d4.m_value) goto LAB_012326c8;
  pTVar2 = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_838[0]._M_dataplus._M_p = (pointer)&local_838[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"QueryAll","");
  local_9b8._0_8_ = local_9a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9b8,"Query all to exactly right sized buffer","");
  tcu::ScopedLogSection::ScopedLogSection(&local_9e0,pTVar2,local_838,(string *)local_9b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._0_8_ != local_9a8) {
    operator_delete((void *)local_9b8._0_8_,local_9a8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838[0]._M_dataplus._M_p != &local_838[0].field_2) {
    operator_delete(local_838[0]._M_dataplus._M_p,local_838[0].field_2._M_allocated_capacity + 1);
  }
  memset(local_838,0,0x800);
  local_838[0]._M_dataplus._M_p._0_1_ = 0x78;
  local_9e4 = 0;
  glu::CallLogWrapper::glGetProgramInfoLog
            (this_00,program,local_9d4.m_value,&local_9e4,(GLchar *)local_838);
  if (local_9d4.m_value != 0) {
    if (local_9e4 + 1 == local_9d4.m_value) {
      if (*(char *)((long)&local_838[0]._M_dataplus._M_p + (long)local_9e4) != '\0') {
        local_9b8._0_8_ =
             ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_9b8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"// ERROR: Expected null terminator at index ",0x2c);
        std::ostream::operator<<(poVar1,local_9e4);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_9b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_940);
        pTVar4 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
        if (pTVar4->m_testResult == QP_TEST_RESULT_PASS) {
          pcVar3 = "missing null terminator";
          goto LAB_012326b4;
        }
      }
    }
    else {
      local_9b8._0_8_ =
           ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_9b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"// ERROR: Expected INFO_LOG_LENGTH ",0x23);
      std::ostream::operator<<(poVar1,local_9e4 + 1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"; got ",6);
      std::ostream::operator<<(poVar1,local_9d4.m_value);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_9b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_940);
      pTVar4 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      if (pTVar4->m_testResult == QP_TEST_RESULT_PASS) {
        pcVar3 = "got invalid log length";
LAB_012326b4:
        tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_FAIL,pcVar3);
      }
    }
  }
  tcu::TestLog::endSection(local_9e0.m_log);
LAB_012326c8:
  pTVar2 = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_838[0]._M_dataplus._M_p = (pointer)&local_838[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"QueryNone","");
  local_9b8._0_8_ = local_9a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9b8,"Query none","");
  tcu::ScopedLogSection::ScopedLogSection(&local_9e0,pTVar2,local_838,(string *)local_9b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._0_8_ != local_9a8) {
    operator_delete((void *)local_9b8._0_8_,local_9a8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838[0]._M_dataplus._M_p != &local_838[0].field_2) {
    operator_delete(local_838[0]._M_dataplus._M_p,local_838[0].field_2._M_allocated_capacity + 1);
  }
  memset(local_838,0,0x800);
  local_838[0]._M_dataplus._M_p._0_1_ = 0x78;
  local_9e4 = 0;
  glu::CallLogWrapper::glGetProgramInfoLog(this_00,program,1,&local_9e4,(GLchar *)local_838);
  if (local_9e4 != 0) {
    local_9b8._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_9b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: Expected write length 0; got ",0x27);
    std::ostream::operator<<(poVar1,local_9e4);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_9b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_940);
    pTVar4 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar4->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_FAIL,"got invalid log length");
    }
  }
  tcu::TestLog::endSection(local_9e0.m_log);
  glu::CallLogWrapper::glDeleteShader(this_00,shader);
  glu::CallLogWrapper::glDeleteShader(this_00,shader_00);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		enum
		{
			BUF_SIZE = 2048
		};

		static const char* const linkErrorVtxSource = "#version 300 es\n"
													  "in highp vec4 a_pos;\n"
													  "uniform highp vec4 u_uniform;\n"
													  "void main ()\n"
													  "{\n"
													  "	gl_Position = a_pos + u_uniform;\n"
													  "}\n";
		static const char* const linkErrorFrgSource = "#version 300 es\n"
													  "in highp vec4 v_missingVar;\n"
													  "uniform highp int u_uniform;\n"
													  "layout(location = 0) out mediump vec4 fragColor;\n"
													  "void main ()\n"
													  "{\n"
													  "	fragColor = v_missingVar + vec4(float(u_uniform));\n"
													  "}\n";

		const char* vtxSource = (m_buildErrorType == BUILDERROR_COMPILE) ? (brokenShader) : (linkErrorVtxSource);
		const char* frgSource = (m_buildErrorType == BUILDERROR_COMPILE) ? (brokenShader) : (linkErrorFrgSource);

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &vtxSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &frgSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);

		StateQueryMemoryWriteGuard<GLint> logLength;
		glGetProgramiv(program, GL_INFO_LOG_LENGTH, &logLength);
		logLength.verifyValidity(m_testCtx);

		// check INFO_LOG_LENGTH == GetProgramInfoLog len
		{
			const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "QueryLarge", "Query to large buffer");
			char						buffer[BUF_SIZE]	= {'x'};
			GLint						written				= 0;

			glGetProgramInfoLog(program, BUF_SIZE, &written, buffer);

			if (logLength != 0 && written+1 != logLength) // INFO_LOG_LENGTH contains 0-terminator
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected INFO_LOG_LENGTH " << written+1 << "; got " << logLength << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid log length");
			}
			else if (logLength != 0 && buffer[written] != '\0')
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected null terminator at index " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing null terminator");
			}
		}

		// check query to just correct sized buffer
		if (BUF_SIZE > logLength)
		{
			const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "QueryAll", "Query all to exactly right sized buffer");
			char						buffer[BUF_SIZE]	= {'x'};
			GLint						written				= 0;

			glGetProgramInfoLog(program, logLength, &written, buffer);

			if (logLength != 0 && written+1 != logLength) // INFO_LOG_LENGTH contains 0-terminator
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected INFO_LOG_LENGTH " << written+1 << "; got " << logLength << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid log length");
			}
			else if (logLength != 0 && buffer[written] != '\0')
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected null terminator at index " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing null terminator");
			}
		}

		// check GetProgramInfoLog works with too small buffer
		{
			const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "QueryNone", "Query none");
			char						buffer[BUF_SIZE]	= {'x'};
			GLint						written				= 0;

			glGetProgramInfoLog(program, 1, &written, buffer);

			if (written != 0)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected write length 0; got " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid log length");
			}
		}

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}